

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O3

int32_t ucal_getDSTSavings_63(UChar *zoneID,UErrorCode *ec)

{
  int32_t iVar1;
  TimeZone *pTVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  UDate UVar6;
  int32_t dst;
  int32_t raw;
  int local_44;
  double local_40;
  undefined1 local_34 [4];
  
  pTVar2 = _createTimeZone(zoneID,-1,ec);
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((pTVar2 == (TimeZone *)0x0) ||
       (plVar3 = (long *)__dynamic_cast(pTVar2,&icu_63::TimeZone::typeinfo,
                                        &icu_63::SimpleTimeZone::typeinfo,0), plVar3 == (long *)0x0)
       ) {
      iVar5 = 0x35;
      UVar6 = icu_63::Calendar::getNow();
      iVar1 = 0;
      do {
        local_40 = UVar6;
        (*(pTVar2->super_UObject)._vptr_UObject[6])(pTVar2,0,local_34,&local_44,ec);
        iVar4 = local_44;
        if (local_44 == 0) {
          iVar4 = iVar1;
        }
        if ((U_ZERO_ERROR < *ec) || (iVar1 = iVar4, local_44 != 0)) break;
        UVar6 = local_40 + 604800000.0;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    else {
      iVar1 = (**(code **)(*plVar3 + 0x68))(plVar3);
    }
  }
  else {
    iVar1 = 0;
    if (pTVar2 == (TimeZone *)0x0) {
      return 0;
    }
  }
  (*(pTVar2->super_UObject)._vptr_UObject[1])(pTVar2);
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucal_getDSTSavings(const UChar* zoneID, UErrorCode* ec) {
    int32_t result = 0;
    TimeZone* zone = _createTimeZone(zoneID, -1, ec);
    if (U_SUCCESS(*ec)) {
        SimpleTimeZone* stz = dynamic_cast<SimpleTimeZone*>(zone);
        if (stz != NULL) {
            result = stz->getDSTSavings();
        } else {
            // Since there is no getDSTSavings on TimeZone, we use a
            // heuristic: Starting with the current time, march
            // forwards for one year, looking for DST savings.
            // Stepping by weeks is sufficient.
            UDate d = Calendar::getNow();
            for (int32_t i=0; i<53; ++i, d+=U_MILLIS_PER_DAY*7.0) {
                int32_t raw, dst;
                zone->getOffset(d, FALSE, raw, dst, *ec);
                if (U_FAILURE(*ec)) {
                    break;
                } else if (dst != 0) {
                    result = dst;
                    break;
                }
            }
        }
    }
    delete zone;
    return result;
}